

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O1

void __thiscall ktxValidator::validateDataSize(ktxValidator *this,validationContext *ctx)

{
  long lVar1;
  int *piVar2;
  char *pcVar3;
  long lVar4;
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  undefined1 local_50 [8];
  _Alloc_hider local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  lVar1 = std::istream::tellg();
  std::istream::seekg((long)ctx->inp,_S_beg);
  if (((byte)ctx->inp[*(long *)(*(long *)ctx->inp + -0x18) + 0x20] & 5) != 0) {
    local_50._0_4_ = IOError.FileSeekEndFailure.code;
    local_48._M_p = (pointer)&local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,IOError.FileSeekEndFailure.message._M_dataplus._M_p,
               IOError.FileSeekEndFailure.message._M_dataplus._M_p +
               IOError.FileSeekEndFailure.message._M_string_length);
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    addIssue<char*>(this,eFatal,(issue *)local_50,pcVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_p != &local_38) {
      operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
    }
  }
  lVar4 = std::istream::tellg();
  if (lVar4 < 0) {
    local_78._0_4_ = IOError.FileTellFailure.code;
    local_70._M_p = (pointer)&local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,IOError.FileTellFailure.message._M_dataplus._M_p,
               IOError.FileTellFailure.message._M_dataplus._M_p +
               IOError.FileTellFailure.message._M_string_length);
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    addIssue<char*>(this,eFatal,(issue *)local_78,pcVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_p != &local_60) {
      operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
    }
  }
  if (lVar4 - lVar1 != ctx->dataSizeFromLevelIndex) {
    local_a0._0_4_ = FileError.IncorrectDataSize.code;
    local_98._M_p = (pointer)&local_88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,FileError.IncorrectDataSize.message._M_dataplus._M_p,
               FileError.IncorrectDataSize.message._M_dataplus._M_p +
               FileError.IncorrectDataSize.message._M_string_length);
    addIssue<>(this,eError,(issue *)local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_p != &local_88) {
      operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void
ktxValidator::validateDataSize(validationContext& ctx)
{
    // Expects to be called after validateSgd so current file offset is at
    // the start of the data.
    uint64_t dataSizeInFile;
    off_t dataStart = (off_t)(ctx.inp->tellg());

    ctx.inp->seekg(0, ios_base::end);
    if (ctx.inp->fail())
        addIssue(logger::eFatal, IOError.FileSeekEndFailure,
                 strerror(errno));
    off_t dataEnd = (off_t)(ctx.inp->tellg());
    if (dataEnd < 0)
        addIssue(logger::eFatal, IOError.FileTellFailure, strerror(errno));
    dataSizeInFile = dataEnd - dataStart;
    if (dataSizeInFile != ctx.dataSizeFromLevelIndex)
        addIssue(logger::eError, FileError.IncorrectDataSize);
}